

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O1

void raster_size(char *fn,int num,int *x,int *y)

{
  uint __fd;
  ssize_t sVar1;
  int *piVar2;
  int *extraout_RDX;
  int iVar3;
  char *s3;
  raster_t hd;
  string s2;
  string s1;
  undefined1 auStack_f8 [4];
  int local_f4;
  int local_f0;
  char local_d8 [80];
  char local_88 [88];
  
  piVar2 = y;
  sprintf(local_88,"%d",num);
  s3 = local_d8;
  concat(fn,local_88,s3);
  iVar3 = 0;
  __fd = open(s3,0);
  if (0 < (int)__fd) {
    s3 = (char *)(ulong)__fd;
    iVar3 = (int)auStack_f8;
    sVar1 = read(__fd,auStack_f8,0x20);
    if (sVar1 == 0x20) {
      *x = local_f4;
      *y = local_f0;
      if ((0x13c < *x) || (0x13c < local_f0)) goto LAB_0010332c;
    }
    close(__fd);
    return;
  }
  raster_size_cold_1();
LAB_0010332c:
  raster_size_cold_2();
  *extraout_RDX = iVar3;
  *piVar2 = (int)s3;
  if (((int)s3 < 0x13d) && (*extraout_RDX < 0x13d)) {
    return;
  }
  binary_size_cold_1();
  if ((ulong)s3 >> 0x20 != 0xffffffff && (int)s3 != -1) {
    return;
  }
  return;
}

Assistant:

void raster_size(fn,num,x,y)
char *fn ;
int num, *x, *y ;

{ raster_t hd ;
  string s1, s2 ;
  int fd ;

  sprintf(s1,"%d",num);
  concat(fn,s1,s2) ;
  if ((fd = open(s2,O_RDONLY)) > 0) {
    if (read(fd,&hd,sizeof(hd)) == sizeof(hd)) {
      *x = hd.width ;
      *y = hd.height ;
      if (*x > X || *y > Y) {
        error(10) ;
      }
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}